

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_diag_avx2_256_16.c
# Opt level: O2

void arr_store_si256(int *array,__m256i vH,int32_t t,int32_t seglen,int32_t d,int32_t dlen)

{
  ulong uVar1;
  long lVar2;
  char in_XMM0_Ba;
  char in_XMM0_Bb;
  char in_XMM0_Bc;
  char in_XMM0_Bd;
  char in_XMM0_Be;
  char in_XMM0_Bf;
  char in_XMM0_Bg;
  char in_XMM0_Bh;
  char in_YMM0_H;
  char in_register_00001211;
  char in_register_00001212;
  char in_register_00001213;
  char in_register_00001214;
  char in_register_00001215;
  char in_register_00001216;
  char in_register_00001217;
  
  uVar1 = (ulong)(uint)dlen;
  lVar2 = (long)d;
  array[uVar1 * (long)t + lVar2] = (int)in_XMM0_Ba;
  array[(long)(seglen + t) * uVar1 + lVar2] = (int)in_XMM0_Bb;
  array[(long)(t + seglen * 2) * uVar1 + lVar2] = (int)in_XMM0_Bc;
  array[(long)(seglen * 3 + t) * uVar1 + lVar2] = (int)in_XMM0_Bd;
  array[(long)(t + seglen * 4) * uVar1 + lVar2] = (int)in_XMM0_Be;
  array[(long)(seglen * 5 + t) * uVar1 + lVar2] = (int)in_XMM0_Bf;
  array[(long)(seglen * 6 + t) * uVar1 + lVar2] = (int)in_XMM0_Bg;
  array[(long)(seglen * 7 + t) * uVar1 + lVar2] = (int)in_XMM0_Bh;
  array[(long)(t + seglen * 8) * uVar1 + lVar2] = (int)in_XMM0_Ba;
  array[(long)(seglen * 9 + t) * uVar1 + lVar2] = (int)in_XMM0_Bb;
  array[(long)(seglen * 10 + t) * uVar1 + lVar2] = (int)in_XMM0_Bc;
  array[(long)(seglen * 0xb + t) * uVar1 + lVar2] = (int)in_XMM0_Bd;
  array[(long)(seglen * 0xc + t) * uVar1 + lVar2] = (int)in_XMM0_Be;
  array[(long)(seglen * 0xd + t) * uVar1 + lVar2] = (int)in_XMM0_Bf;
  array[(long)(seglen * 0xe + t) * uVar1 + lVar2] = (int)in_XMM0_Bg;
  array[(long)(seglen * 0xf + t) * uVar1 + lVar2] = (int)in_XMM0_Bh;
  array[(long)(seglen * 0x10 + t) * uVar1 + lVar2] = (int)in_YMM0_H;
  array[(long)(seglen * 0x11 + t) * uVar1 + lVar2] = (int)in_register_00001211;
  array[(long)(seglen * 0x12 + t) * uVar1 + lVar2] = (int)in_register_00001212;
  array[(long)(seglen * 0x13 + t) * uVar1 + lVar2] = (int)in_register_00001213;
  array[(long)(seglen * 0x14 + t) * uVar1 + lVar2] = (int)in_register_00001214;
  array[(long)(seglen * 0x15 + t) * uVar1 + lVar2] = (int)in_register_00001215;
  array[(long)(seglen * 0x16 + t) * uVar1 + lVar2] = (int)in_register_00001216;
  array[(long)(seglen * 0x17 + t) * uVar1 + lVar2] = (int)in_register_00001217;
  array[(long)(seglen * 0x18 + t) * uVar1 + lVar2] = (int)in_YMM0_H;
  array[(long)(seglen * 0x19 + t) * uVar1 + lVar2] = (int)in_register_00001211;
  array[(long)(seglen * 0x1a + t) * uVar1 + lVar2] = (int)in_register_00001212;
  array[(long)(seglen * 0x1b + t) * uVar1 + lVar2] = (int)in_register_00001213;
  array[(long)(seglen * 0x1c + t) * uVar1 + lVar2] = (int)in_register_00001214;
  array[(long)(seglen * 0x1d + t) * uVar1 + lVar2] = (int)in_register_00001215;
  array[(long)(seglen * 0x1e + t) * uVar1 + lVar2] = (int)in_register_00001216;
  array[(long)(seglen * 0x1f + t) * uVar1 + lVar2] = (int)in_register_00001217;
  return;
}

Assistant:

static inline void arr_store_si256(
        int *array,
        __m256i vWH,
        int32_t i,
        int32_t s1Len,
        int32_t j,
        int32_t s2Len)
{
    if (0 <= i+0 && i+0 < s1Len && 0 <= j-0 && j-0 < s2Len) {
        array[1LL*(i+0)*s2Len + (j-0)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 15);
    }
    if (0 <= i+1 && i+1 < s1Len && 0 <= j-1 && j-1 < s2Len) {
        array[1LL*(i+1)*s2Len + (j-1)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 14);
    }
    if (0 <= i+2 && i+2 < s1Len && 0 <= j-2 && j-2 < s2Len) {
        array[1LL*(i+2)*s2Len + (j-2)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 13);
    }
    if (0 <= i+3 && i+3 < s1Len && 0 <= j-3 && j-3 < s2Len) {
        array[1LL*(i+3)*s2Len + (j-3)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 12);
    }
    if (0 <= i+4 && i+4 < s1Len && 0 <= j-4 && j-4 < s2Len) {
        array[1LL*(i+4)*s2Len + (j-4)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 11);
    }
    if (0 <= i+5 && i+5 < s1Len && 0 <= j-5 && j-5 < s2Len) {
        array[1LL*(i+5)*s2Len + (j-5)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 10);
    }
    if (0 <= i+6 && i+6 < s1Len && 0 <= j-6 && j-6 < s2Len) {
        array[1LL*(i+6)*s2Len + (j-6)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 9);
    }
    if (0 <= i+7 && i+7 < s1Len && 0 <= j-7 && j-7 < s2Len) {
        array[1LL*(i+7)*s2Len + (j-7)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 8);
    }
    if (0 <= i+8 && i+8 < s1Len && 0 <= j-8 && j-8 < s2Len) {
        array[1LL*(i+8)*s2Len + (j-8)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 7);
    }
    if (0 <= i+9 && i+9 < s1Len && 0 <= j-9 && j-9 < s2Len) {
        array[1LL*(i+9)*s2Len + (j-9)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 6);
    }
    if (0 <= i+10 && i+10 < s1Len && 0 <= j-10 && j-10 < s2Len) {
        array[1LL*(i+10)*s2Len + (j-10)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 5);
    }
    if (0 <= i+11 && i+11 < s1Len && 0 <= j-11 && j-11 < s2Len) {
        array[1LL*(i+11)*s2Len + (j-11)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 4);
    }
    if (0 <= i+12 && i+12 < s1Len && 0 <= j-12 && j-12 < s2Len) {
        array[1LL*(i+12)*s2Len + (j-12)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 3);
    }
    if (0 <= i+13 && i+13 < s1Len && 0 <= j-13 && j-13 < s2Len) {
        array[1LL*(i+13)*s2Len + (j-13)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 2);
    }
    if (0 <= i+14 && i+14 < s1Len && 0 <= j-14 && j-14 < s2Len) {
        array[1LL*(i+14)*s2Len + (j-14)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 1);
    }
    if (0 <= i+15 && i+15 < s1Len && 0 <= j-15 && j-15 < s2Len) {
        array[1LL*(i+15)*s2Len + (j-15)] = (int16_t)_mm256_extract_epi16_rpl(vWH, 0);
    }
}